

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

void dump_monsters(ang_file *fff)

{
  ulong uVar1;
  long lVar2;
  
  if (z_info->r_max != 0) {
    lVar2 = 4;
    uVar1 = 0;
    do {
      if (*(long *)(r_info->flags + lVar2 * 4 + -0x5c) != 0) {
        file_putf(fff,"monster:%s:0x%02X:0x%02X\n",*(long *)(r_info->flags + lVar2 * 4 + -0x5c),
                  (ulong)monster_x_attr[uVar1],(ulong)(uint)monster_x_char[uVar1]);
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x34;
    } while (uVar1 < z_info->r_max);
  }
  return;
}

Assistant:

void dump_monsters(ang_file *fff)
{
	int i;

	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		uint8_t attr = monster_x_attr[i];
		wint_t chr = monster_x_char[i];

		/* Skip non-entries */
		if (!race->name) continue;

		file_putf(fff, "monster:%s:0x%02X:0x%02X\n", race->name, attr, chr);
	}
}